

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

unique_ptr<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>_>
 __thiscall
bioparser::Parser<biosoup::NucleicAcid>::Create<bioparser::FastaParser>
          (Parser<biosoup::NucleicAcid> *this,string *path)

{
  gzFile file;
  Parser<biosoup::NucleicAcid> *this_00;
  invalid_argument *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  file = (gzFile)gzopen((path->_M_dataplus)._M_p,"r");
  if (file != (gzFile)0x0) {
    this_00 = (Parser<biosoup::NucleicAcid> *)operator_new(0x58);
    Parser(this_00,file,0x400000);
    this_00->_vptr_Parser = (_func_int **)&PTR__Parser_00155b58;
    this->_vptr_Parser = (_func_int **)this_00;
    return (__uniq_ptr_data<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>,_true,_true>
            )(__uniq_ptr_data<bioparser::Parser<biosoup::NucleicAcid>,_std::default_delete<bioparser::Parser<biosoup::NucleicAcid>_>,_true,_true>
              )this;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_48,"[bioparser::Parser::Create] error: unable to open file ",path);
  std::invalid_argument::invalid_argument(this_01,(string *)&bStack_48);
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static std::unique_ptr<Parser<T>> Create(const std::string& path) {
    auto file = gzopen(path.c_str(), "r");
    if (file == nullptr) {
      throw std::invalid_argument(
          "[bioparser::Parser::Create] error: unable to open file " + path);
    }
    return std::unique_ptr<Parser<T>>(new P<T>(file));
  }